

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

int do_late_binding(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  _Bool _Var3;
  long lVar4;
  long in_FS_OFFSET;
  uint32_t local_44;
  _Bool type_set;
  uint32_t type;
  _Bool flags_set;
  char *pcStack_38;
  uint32_t flags;
  char *payload_path;
  char *device_path;
  char **local_20;
  char **argv_local;
  long lStack_10;
  int argc_local;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  payload_path = (char *)0x0;
  pcStack_38 = (char *)0x0;
  type = 0;
  bVar1 = false;
  local_44 = 0;
  bVar2 = false;
  local_20 = argv;
  argv_local._4_4_ = argc;
  if (argc < 1) {
    if (!quiet) {
      fprintf(_stderr,"Error: No arguments provided\n");
    }
    device_path._4_4_ = -1;
  }
  else {
    do {
      _Var3 = arg_is_device(*local_20);
      if (_Var3) {
        _Var3 = arg_next((int *)((long)&argv_local + 4),&local_20);
        if (!_Var3) {
          if ((quiet & 1U) == 0) {
            fprintf(_stderr,"Error: No device to send the command to\n");
          }
          device_path._4_4_ = -1;
          goto LAB_001060be;
        }
        payload_path = *local_20;
      }
      else {
        _Var3 = arg_is_payload(*local_20);
        if (_Var3) {
          _Var3 = arg_next((int *)((long)&argv_local + 4),&local_20);
          if (!_Var3) {
            if ((quiet & 1U) == 0) {
              fprintf(_stderr,"Error: No payload file to send\n");
            }
            device_path._4_4_ = -1;
            goto LAB_001060be;
          }
          pcStack_38 = *local_20;
        }
        else {
          _Var3 = arg_is_flags(*local_20);
          if (_Var3) {
            _Var3 = arg_next((int *)((long)&argv_local + 4),&local_20);
            if (!_Var3) {
              if ((quiet & 1U) == 0) {
                fprintf(_stderr,"Error: No flags argument provided\n");
              }
              device_path._4_4_ = -1;
              goto LAB_001060be;
            }
            lVar4 = strtol(*local_20,(char **)0x0,0x10);
            type = (uint32_t)lVar4;
            bVar1 = true;
          }
          else {
            _Var3 = arg_is_type(*local_20);
            if (!_Var3) {
              if ((quiet & 1U) == 0) {
                fprintf(_stderr,"Error: Wrong argument %s\n",*local_20);
              }
              device_path._4_4_ = -1;
              goto LAB_001060be;
            }
            _Var3 = arg_next((int *)((long)&argv_local + 4),&local_20);
            if (!_Var3) {
              if ((quiet & 1U) == 0) {
                fprintf(_stderr,"Error: No payload type argument provided\n");
              }
              device_path._4_4_ = -1;
              goto LAB_001060be;
            }
            _Var3 = arg_is_vr_config(*local_20);
            if (_Var3) {
              local_44 = 2;
            }
            else {
              _Var3 = arg_is_fan_table(*local_20);
              if (!_Var3) {
                if ((quiet & 1U) == 0) {
                  fprintf(_stderr,"Error: Bad payload type argument %s\n",*local_20);
                }
                device_path._4_4_ = -1;
                goto LAB_001060be;
              }
              local_44 = 1;
            }
            bVar2 = true;
          }
        }
      }
      _Var3 = arg_next((int *)((long)&argv_local + 4),&local_20);
    } while (_Var3);
    if (((pcStack_38 == (char *)0x0) || (!bVar1)) || (!bVar2)) {
      if ((quiet & 1U) == 0) {
        fprintf(_stderr,"Error: No payload file or payload type or flags provided\n");
      }
      device_path._4_4_ = -1;
    }
    else {
      device_path._4_4_ = late_binding(payload_path,pcStack_38,local_44,type);
    }
  }
LAB_001060be:
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return device_path._4_4_;
}

Assistant:

static int do_late_binding(int argc, char *argv[])
{
    const char *device_path = NULL;
    const char *payload_path = NULL;
    uint32_t flags = 0;
    bool flags_set = false;
    uint32_t type = 0;
    bool type_set = false;

    if (argc <= 0)
    {
        fwupd_error("No arguments provided\n");
        return ERROR_BAD_ARGUMENT;
    }

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device to send the command to\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_payload(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload file to send\n");
                return ERROR_BAD_ARGUMENT;
            }
            payload_path = argv[0];
        }
        else if (arg_is_flags(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No flags argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            flags = (uint32_t)strtol(argv[0], NULL, 16);
            flags_set = true;
        }
        else if (arg_is_type(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload type argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_vr_config(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_VR_CONFIG;
            }
            else if (arg_is_fan_table(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_FAN_TABLE;
            }
            else
            {
                fwupd_error("Bad payload type argument %s\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
            type_set = true;
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (payload_path && flags_set && type_set)
    {
        return late_binding(device_path, payload_path, type, flags);
    }

    fwupd_error("No payload file or payload type or flags provided\n");
    return ERROR_BAD_ARGUMENT;
}